

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O0

void __thiscall
ConfidentialValue_Constractor_hex33_version0_Test::TestBody
          (ConfidentialValue_Constractor_hex33_version0_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertHelper local_188;
  Message local_180;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_3;
  Message local_158 [2];
  int64_t local_148;
  undefined1 local_140;
  Amount local_138;
  long local_128;
  int64_t satoshi;
  Message local_118;
  bool local_10a;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  Message local_f0;
  int local_e4;
  ByteData local_e0;
  size_t local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  string local_a0;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  ConfidentialValue value;
  ConfidentialValue_Constractor_hex33_version0_Test *this_local;
  
  value._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_58,
             "00b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226",&local_59);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_a0,(ConfidentialValue *)local_38);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ((internal *)local_80,"value.GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  cfd::core::ConfidentialValue::GetData(&local_e0,(ConfidentialValue *)local_38);
  local_c8 = cfd::core::ByteData::GetDataSize(&local_e0);
  local_e4 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_c0,"value.GetData().GetDataSize()","0",&local_c8,&local_e4);
  cfd::core::ByteData::~ByteData(&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_109 = cfd::core::ConfidentialValue::HasBlinding((ConfidentialValue *)local_38);
  local_10a = false;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_108,"value.HasBlinding()","false",&local_109,&local_10a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&satoshi,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&satoshi,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&satoshi);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_128 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      AVar3 = cfd::core::ConfidentialValue::GetAmount((ConfidentialValue *)local_38);
      local_148 = AVar3.amount_;
      local_140 = AVar3.ignore_check_;
      local_138.amount_ = local_148;
      local_138.ignore_check_ = (bool)local_140;
      local_128 = cfd::core::Amount::GetSatoshiValue(&local_138);
    }
  }
  else {
    testing::Message::Message(local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x59,
               "Expected: (satoshi = value.GetAmount().GetSatoshiValue()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_158);
  }
  local_174 = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_170,"satoshi","0",&local_128,&local_174);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)local_38);
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_hex33_version0) {
  // 33byte
  ConfidentialValue value(
      "00b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226");
  EXPECT_STREQ(value.GetHex().c_str(), "");
  EXPECT_EQ(value.GetData().GetDataSize(), 0);
  EXPECT_EQ(value.HasBlinding(), false);
  int64_t satoshi = 0;
  EXPECT_NO_THROW((satoshi = value.GetAmount().GetSatoshiValue()));
  EXPECT_EQ(satoshi, 0);
}